

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void renameColumnIdlistNames(Parse *pParse,RenameCtx *pCtx,IdList *pIdList,char *zOld)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  RenameToken **ppRVar4;
  long lVar5;
  RenameToken *pToken;
  long lVar6;
  RenameToken *pRVar7;
  RenameToken *pRVar8;
  
  if ((pIdList != (IdList *)0x0) && (iVar2 = pIdList->nId, 0 < (long)iVar2)) {
    lVar5 = 0;
    do {
      pcVar3 = pIdList->a[lVar5].zName;
      if (pcVar3 == (char *)0x0) {
        if (zOld == (char *)0x0) {
LAB_001bfe78:
          pRVar8 = pParse->pRename;
          if (pRVar8 != (RenameToken *)0x0) {
            ppRVar4 = &pParse->pRename;
            if ((char *)pRVar8->p != pcVar3) {
              do {
                pRVar7 = pRVar8;
                pRVar8 = pRVar7->pNext;
                if (pRVar8 == (RenameToken *)0x0) goto LAB_001bfeb1;
              } while ((char *)pRVar8->p != pcVar3);
              ppRVar4 = &pRVar7->pNext;
            }
            *ppRVar4 = pRVar8->pNext;
            pRVar8->pNext = pCtx->pList;
            pCtx->pList = pRVar8;
            pCtx->nList = pCtx->nList + 1;
          }
        }
      }
      else if (zOld != (char *)0x0) {
        lVar6 = 0;
        do {
          bVar1 = pcVar3[lVar6];
          if (bVar1 == zOld[lVar6]) {
            if ((ulong)bVar1 == 0) goto LAB_001bfe78;
          }
          else if (""[bVar1] != ""[(byte)zOld[lVar6]]) break;
          lVar6 = lVar6 + 1;
        } while( true );
      }
LAB_001bfeb1:
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar2);
  }
  return;
}

Assistant:

static void renameColumnIdlistNames(
  Parse *pParse, 
  RenameCtx *pCtx, 
  IdList *pIdList, 
  const char *zOld
){
  if( pIdList ){
    int i;
    for(i=0; i<pIdList->nId; i++){
      char *zName = pIdList->a[i].zName;
      if( 0==sqlite3_stricmp(zName, zOld) ){
        renameTokenFind(pParse, pCtx, (void*)zName);
      }
    }
  }
}